

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomFunc(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  ulong local_28;
  sqlite_int64 r;
  sqlite3_value **NotUsed2_local;
  sqlite3_context *psStack_10;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  r = (sqlite_int64)NotUsed2;
  NotUsed2_local._4_4_ = NotUsed;
  psStack_10 = context;
  sqlite3_randomness(8,&local_28);
  if ((long)local_28 < 0) {
    local_28 = -(local_28 & 0x7fffffffffffffff);
  }
  sqlite3_result_int64(psStack_10,local_28);
  return;
}

Assistant:

static void randomFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite_int64 r;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_randomness(sizeof(r), &r);
  if( r<0 ){
    /* We need to prevent a random number of 0x8000000000000000 
    ** (or -9223372036854775808) since when you do abs() of that
    ** number of you get the same value back again.  To do this
    ** in a way that is testable, mask the sign bit off of negative
    ** values, resulting in a positive value.  Then take the 
    ** 2s complement of that positive value.  The end result can
    ** therefore be no less than -9223372036854775807.
    */
    r = -(r & LARGEST_INT64);
  }
  sqlite3_result_int64(context, r);
}